

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * ip2string_abi_cxx11_(uint32_t ip)

{
  ostream *poVar1;
  uint in_ESI;
  string *in_RDI;
  ostringstream out;
  ostringstream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_188,local_c >> 0x18);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c >> 0x10 & 0xff);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c >> 8 & 0xff);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,(uint)(byte)local_c);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string ip2string(const uint32_t ip)
{
  std::ostringstream out;

  out << ((ip>>24)&0xff) << '.' << ((ip>>16)&0xff) << '.'
      << ((ip>>8)&0xff) << '.' << (ip&0xff);

  return out.str();
}